

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

uint pugi::impl::anon_unknown_0::hash_string(char_t *str)

{
  uint local_14;
  byte *pbStack_10;
  uint result;
  char_t *str_local;
  
  local_14 = 0;
  for (pbStack_10 = str; *pbStack_10 != 0; pbStack_10 = pbStack_10 + 1) {
    local_14 = (*pbStack_10 + local_14) * 0x401;
    local_14 = local_14 >> 6 ^ local_14;
  }
  return (local_14 * 9 >> 0xb ^ local_14 * 9) * 0x8001;
}

Assistant:

PUGI__FN PUGI__UNSIGNED_OVERFLOW unsigned int hash_string(const char_t* str)
	{
		// Jenkins one-at-a-time hash (http://en.wikipedia.org/wiki/Jenkins_hash_function#one-at-a-time)
		unsigned int result = 0;

		while (*str)
		{
			result += static_cast<unsigned int>(*str++);
			result += result << 10;
			result ^= result >> 6;
		}

		result += result << 3;
		result ^= result >> 11;
		result += result << 15;

		return result;
	}